

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::SetCollide(ChParticleCloud *this,bool mcoll)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  pointer ppCVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (this->do_collide != mcoll) {
    if (mcoll) {
      this->do_collide = true;
      if (((this->super_ChIndexedParticles).super_ChPhysicsItem.system != (ChSystem *)0x0) &&
         (ppCVar5 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (this->particles).
         super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
         super__Vector_impl_data._M_finish != ppCVar5)) {
        uVar6 = 0;
        uVar7 = 1;
        do {
          pCVar1 = (this->super_ChIndexedParticles).super_ChPhysicsItem.system;
          peVar2 = (pCVar1->collision_system).
                   super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var3 = (pCVar1->collision_system).
                   super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
              ppCVar5 = (this->particles).
                        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          (*peVar2->_vptr_ChCollisionSystem[4])(peVar2,ppCVar5[uVar6]->collision_model);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          ppCVar5 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar7 < (ulong)((long)(this->particles).
                                        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5
                                 >> 3);
          uVar6 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar4);
      }
    }
    else {
      this->do_collide = false;
      if (((this->super_ChIndexedParticles).super_ChPhysicsItem.system != (ChSystem *)0x0) &&
         (ppCVar5 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (this->particles).
         super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
         super__Vector_impl_data._M_finish != ppCVar5)) {
        uVar6 = 0;
        uVar7 = 1;
        do {
          pCVar1 = (this->super_ChIndexedParticles).super_ChPhysicsItem.system;
          peVar2 = (pCVar1->collision_system).
                   super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var3 = (pCVar1->collision_system).
                   super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
              ppCVar5 = (this->particles).
                        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          (*peVar2->_vptr_ChCollisionSystem[5])(peVar2,ppCVar5[uVar6]->collision_model);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          ppCVar5 = (this->particles).
                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar4 = uVar7 < (ulong)((long)(this->particles).
                                        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5
                                 >> 3);
          uVar6 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar4);
      }
    }
  }
  return;
}

Assistant:

void ChParticleCloud::SetCollide(bool mcoll) {
    if (mcoll == do_collide)
        return;

    if (mcoll) {
        do_collide = true;
        if (GetSystem()) {
            for (unsigned int j = 0; j < particles.size(); j++) {
                GetSystem()->GetCollisionSystem()->Add(particles[j]->collision_model);
            }
        }
    } else {
        do_collide = false;
        if (GetSystem()) {
            for (unsigned int j = 0; j < particles.size(); j++) {
                GetSystem()->GetCollisionSystem()->Remove(particles[j]->collision_model);
            }
        }
    }
}